

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

long openjtalk_getCharCode(char *text)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  
  if (text == (char *)0x0) {
    return 0xc;
  }
  bVar3 = *text;
  if (bVar3 != 0) {
    lVar2 = 1;
    uVar1 = 0;
    do {
      uVar1 = (ulong)bVar3 | uVar1 << 8;
      if ((int)lVar2 == 4) {
        return uVar1;
      }
      bVar3 = text[lVar2];
      lVar2 = lVar2 + 1;
    } while (bVar3 != 0);
    return uVar1;
  }
  return 0;
}

Assistant:

OPENJTALK_DLL_API long OPENJTALK_CONVENTION openjtalk_getCharCode(char *text)
{
	if (!text)
	{
		return OPENJTALKERROR_BUFFER_IS_NULL;
	}
	long res = 0;
	int count = 0;
	for (char *p = text; *p != '\0'; p++)
	{
		res <<= sizeof(char) * 8;
		res += ((long)*p) & 0xff;
		if (++count == 4)
		{
			break;
		}
	}
	return (long)res;
}